

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChParticleCloud::IntStateScatter
          (ChParticleCloud *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,
          bool full_update)

{
  pointer ppCVar1;
  ChAparticle *pCVar2;
  uint uVar3;
  ulong uVar4;
  ChCoordsys<double> local_a0;
  ChVector<double> local_68 [2];
  
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    ppCVar1 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->particles).
                      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar4)
    break;
    pCVar2 = ppCVar1[uVar4];
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
               &x->super_ChVectorDynamic<double>,(ulong)off_x,7);
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_a0,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)local_68,(type *)0x0);
    ChFrame<double>::SetCoord((ChFrame<double> *)pCVar2,&local_a0);
    pCVar2 = (this->particles).
             super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4];
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_a0,
               &v->super_ChVectorDynamic<double>,(ulong)off_v,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (local_68,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_a0,(type *)0x0);
    (**(code **)(*(long *)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                           super_ChFrame<double> + 0x38))(pCVar2,local_68);
    pCVar2 = (this->particles).
             super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4];
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_a0,
               &v->super_ChVectorDynamic<double>,(ulong)(off_v + 3),3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (local_68,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_a0,(type *)0x0);
    (**(code **)(*(long *)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                           super_ChFrame<double> + 0x48))(pCVar2,local_68);
    uVar3 = uVar3 + 1;
    off_v = off_v + 6;
    off_x = off_x + 7;
  }
  (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj.ChTime = T;
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x13])
            (this,(ulong)full_update);
  return;
}

Assistant:

void ChParticleCloud::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                                        const ChState& x,          // state vector, position part
                                        const unsigned int off_v,  // offset in v state vector
                                        const ChStateDelta& v,     // state vector, speed part
                                        const double T,            // time
                                        bool full_update           // perform complete update
) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        particles[j]->SetCoord(x.segment(off_x + 7 * j, 7));
        particles[j]->SetPos_dt(v.segment(off_v + 6 * j, 3));
        particles[j]->SetWvel_loc(v.segment(off_v + 6 * j + 3, 3));
    }
    SetChTime(T);
    Update(T, full_update);
}